

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr xmlDOMWrapStoreNs(xmlDocPtr doc,xmlChar *nsName,xmlChar *prefix)

{
  _xmlNs *p_Var1;
  int iVar2;
  xmlNsPtr pxVar3;
  xmlNsPtr pxVar4;
  
  pxVar3 = doc->oldNs;
  if (doc->oldNs == (xmlNsPtr)0x0) {
    pxVar3 = xmlNewXmlNs();
    doc->oldNs = pxVar3;
    if (pxVar3 == (xmlNsPtr)0x0) {
      return (xmlNsPtr)0x0;
    }
  }
  do {
    p_Var1 = pxVar3->next;
    if (p_Var1 == (_xmlNs *)0x0) {
      pxVar4 = xmlNewNs((xmlNodePtr)0x0,nsName,prefix);
      pxVar3->next = pxVar4;
      return pxVar4;
    }
    pxVar3 = p_Var1;
  } while (((p_Var1->prefix != prefix) && (iVar2 = xmlStrEqual(p_Var1->prefix,prefix), iVar2 == 0))
          || (iVar2 = xmlStrEqual(p_Var1->href,nsName), iVar2 == 0));
  return p_Var1;
}

Assistant:

static xmlNsPtr
xmlDOMWrapStoreNs(xmlDocPtr doc,
		   const xmlChar *nsName,
		   const xmlChar *prefix)
{
    xmlNsPtr ns;

    if (doc == NULL)
	return (NULL);
    ns = xmlTreeEnsureXMLDecl(doc);
    if (ns == NULL)
	return (NULL);
    if (ns->next != NULL) {
	/* Reuse. */
	ns = ns->next;
	while (ns != NULL) {
	    if (((ns->prefix == prefix) ||
		xmlStrEqual(ns->prefix, prefix)) &&
		xmlStrEqual(ns->href, nsName)) {
		return (ns);
	    }
	    if (ns->next == NULL)
		break;
	    ns = ns->next;
	}
    }
    /* Create. */
    if (ns != NULL) {
        ns->next = xmlNewNs(NULL, nsName, prefix);
        return (ns->next);
    }
    return(NULL);
}